

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::GetAsyncCommandResponse_SetupDataSource::
~GetAsyncCommandResponse_SetupDataSource(GetAsyncCommandResponse_SetupDataSource *this)

{
  ~GetAsyncCommandResponse_SetupDataSource(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

GetAsyncCommandResponse_SetupDataSource::~GetAsyncCommandResponse_SetupDataSource() = default;